

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::InitializeFromParent(cmMakefile *this,cmMakefile *parent)

{
  char *this_00;
  bool bVar1;
  char *pcVar2;
  reference s;
  string local_280;
  allocator local_259;
  string local_258;
  allocator local_231;
  string local_230;
  allocator local_209;
  string local_208;
  allocator local_1e1;
  string local_1e0;
  allocator local_1b9;
  string local_1b8;
  allocator local_191;
  string local_190;
  char *local_170;
  char *prop_1;
  allocator local_141;
  undefined1 local_140 [8];
  string defPropName;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_118;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_110;
  const_iterator ci;
  undefined1 local_e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string local_c8;
  allocator local_a1;
  string local_a0;
  PolicyStatus local_80;
  allocator local_79;
  PolicyStatus polSt;
  allocator local_41;
  string local_40;
  char *local_20;
  char *prop;
  cmMakefile *parent_local;
  cmMakefile *this_local;
  
  prop = (char *)parent;
  parent_local = this;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->SystemIncludeDirectories,&parent->SystemIncludeDirectories);
  std::__cxx11::string::operator=((string *)&this->DefineFlags,(string *)(prop + 0x1e0));
  std::__cxx11::string::operator=((string *)&this->DefineFlagsOrig,(string *)(prop + 0x200));
  local_20 = "IMPLICIT_DEPENDS_INCLUDE_TRANSFORM";
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM",&local_41);
  this_00 = prop;
  pcVar2 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&polSt,pcVar2,&local_79);
  pcVar2 = GetProperty((cmMakefile *)this_00,(string *)&polSt);
  SetProperty(this,&local_40,pcVar2);
  std::__cxx11::string::~string((string *)&polSt);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_80 = GetPolicyStatus(this,CMP0043);
  if ((local_80 == WARN) || (local_80 == OLD)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,"COMPILE_DEFINITIONS",&local_a1);
    pcVar2 = prop;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_c8,"COMPILE_DEFINITIONS",
               (allocator *)
               ((long)&configs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar2 = GetProperty((cmMakefile *)pcVar2,&local_c8);
    SetProperty(this,&local_a0,pcVar2);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&configs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_e8);
    GetConfigurations((string *)&ci,this,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_e8,true);
    std::__cxx11::string::~string((string *)&ci);
    local_118._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_e8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_110,&local_118);
    while( true ) {
      defPropName.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_e8);
      bVar1 = __gnu_cxx::operator!=
                        (&local_110,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&defPropName.field_2 + 8));
      if (!bVar1) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_140,"COMPILE_DEFINITIONS_",&local_141);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
      s = __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&local_110);
      cmsys::SystemTools::UpperCase((string *)&prop_1,s);
      std::__cxx11::string::operator+=((string *)local_140,(string *)&prop_1);
      std::__cxx11::string::~string((string *)&prop_1);
      local_170 = GetProperty((cmMakefile *)prop,(string *)local_140);
      SetProperty(this,(string *)local_140,local_170);
      std::__cxx11::string::~string((string *)local_140);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_110);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_190,"LABELS",&local_191);
  pcVar2 = prop;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b8,"LABELS",&local_1b9);
  pcVar2 = GetProperty((cmMakefile *)pcVar2,&local_1b8);
  SetProperty(this,&local_190,pcVar2);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0,"LINK_LIBRARIES",&local_1e1);
  pcVar2 = prop;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"LINK_LIBRARIES",&local_209);
  pcVar2 = GetProperty((cmMakefile *)pcVar2,&local_208);
  SetProperty(this,&local_1e0,pcVar2);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_230,"LINK_DIRECTORIES",&local_231);
  pcVar2 = prop;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_258,"LINK_DIRECTORIES",&local_259);
  pcVar2 = GetProperty((cmMakefile *)pcVar2,&local_258);
  SetProperty(this,&local_230,pcVar2);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  cmStateSnapshot::GetProjectName_abi_cxx11_(&local_280,(cmStateSnapshot *)(prop + 0x260));
  cmStateSnapshot::SetProjectName(&this->StateSnapshot,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::operator=
            ((string *)&this->ComplainFileRegularExpression,(string *)(prop + 0x1c0));
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>_>
  ::operator=(&this->ImportedTargets,
              (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>_>
               *)(prop + 0x6d0));
  return;
}

Assistant:

void cmMakefile::InitializeFromParent(cmMakefile* parent)
{
  this->SystemIncludeDirectories = parent->SystemIncludeDirectories;

  // define flags
  this->DefineFlags = parent->DefineFlags;
  this->DefineFlagsOrig = parent->DefineFlagsOrig;

  // Include transform property.  There is no per-config version.
  {
    const char* prop = "IMPLICIT_DEPENDS_INCLUDE_TRANSFORM";
    this->SetProperty(prop, parent->GetProperty(prop));
  }

  // compile definitions property and per-config versions
  cmPolicies::PolicyStatus polSt = this->GetPolicyStatus(cmPolicies::CMP0043);
  if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD) {
    this->SetProperty("COMPILE_DEFINITIONS",
                      parent->GetProperty("COMPILE_DEFINITIONS"));
    std::vector<std::string> configs;
    this->GetConfigurations(configs);
    for (std::vector<std::string>::const_iterator ci = configs.begin();
         ci != configs.end(); ++ci) {
      std::string defPropName = "COMPILE_DEFINITIONS_";
      defPropName += cmSystemTools::UpperCase(*ci);
      const char* prop = parent->GetProperty(defPropName);
      this->SetProperty(defPropName, prop);
    }
  }

  // labels
  this->SetProperty("LABELS", parent->GetProperty("LABELS"));

  // link libraries
  this->SetProperty("LINK_LIBRARIES", parent->GetProperty("LINK_LIBRARIES"));

  // link directories
  this->SetProperty("LINK_DIRECTORIES",
                    parent->GetProperty("LINK_DIRECTORIES"));

  // the initial project name
  this->StateSnapshot.SetProjectName(parent->StateSnapshot.GetProjectName());

  // Copy include regular expressions.
  this->ComplainFileRegularExpression = parent->ComplainFileRegularExpression;

  // Imported targets.
  this->ImportedTargets = parent->ImportedTargets;
}